

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

int __thiscall
QListModeViewBase::horizontalScrollToValue
          (QListModeViewBase *this,int index,ScrollHint hint,bool leftOf,bool rightOf,QRect *area,
          QRect *rect)

{
  ScrollMode SVar1;
  int iVar2;
  QScrollBar *this_00;
  long lVar3;
  long lVar4;
  ScrollHint hint_00;
  
  iVar2 = index;
  SVar1 = QCommonListViewBase::horizontalScrollMode(&this->super_QCommonListViewBase);
  if (SVar1 == ScrollPerItem) {
    if ((this->scrollValueMap).d.size == 0) {
      iVar2 = 0;
    }
    else {
      this_00 = QCommonListViewBase::horizontalScrollBar(&this->super_QCommonListViewBase);
      iVar2 = QAbstractSlider::value(&this_00->super_QAbstractSlider);
      lVar4 = (this->flowPositions).d.size + -1;
      lVar3 = (long)(this->scrollValueMap).d.ptr[iVar2];
      if (lVar3 <= lVar4) {
        lVar4 = lVar3;
      }
      lVar3 = 0;
      if (0 < lVar4) {
        lVar3 = lVar4;
      }
      iVar2 = (int)lVar3;
    }
    if (rightOf) {
      hint = PositionAtBottom;
    }
    hint_00 = PositionAtTop;
    if (!leftOf) {
      hint_00 = hint;
    }
    if (hint_00 != EnsureVisible) {
      iVar2 = perItemScrollToValue
                        (this,index,iVar2,((area->x2).m_i - (area->x1).m_i) + 1,hint_00,Horizontal,
                         ((this->super_QCommonListViewBase).dd)->wrap,
                         ((rect->x2).m_i - (rect->x1).m_i) + 1);
    }
    return iVar2;
  }
  iVar2 = QCommonListViewBase::horizontalScrollToValue
                    (&this->super_QCommonListViewBase,iVar2,hint,leftOf,rightOf,area,rect);
  return iVar2;
}

Assistant:

int QListModeViewBase::horizontalScrollToValue(int index, QListView::ScrollHint hint,
                                            bool leftOf, bool rightOf, const QRect &area, const QRect &rect) const
{
    if (horizontalScrollMode() != QAbstractItemView::ScrollPerItem)
        return QCommonListViewBase::horizontalScrollToValue(index, hint, leftOf, rightOf, area, rect);

    int value;
    if (scrollValueMap.isEmpty())
        value = 0;
    else
        value = qBound(0, scrollValueMap.at(horizontalScrollBar()->value()), flowPositions.size() - 1);
    if (leftOf)
        hint = QListView::PositionAtTop;
    else if (rightOf)
        hint = QListView::PositionAtBottom;
    if (hint == QListView::EnsureVisible)
        return value;

    return perItemScrollToValue(index, value, area.width(), hint, Qt::Horizontal, isWrapping(), rect.width());
}